

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O1

wchar_t Infoclr_Opcode(char *str)

{
  int iVar1;
  wchar_t wVar2;
  long lVar3;
  
  lVar3 = 8;
  do {
    iVar1 = strcmp(*(char **)((long)&__do_global_dtors_aux_fini_array_entry + lVar3),str);
    if (iVar1 == 0) {
      wVar2 = atoi(*(char **)((long)opcode_pairs + lVar3));
      return wVar2;
    }
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x128);
  return L'\xffffffff';
}

Assistant:

static int Infoclr_Opcode(const char *str)
{
	register int i;

	/* Scan through all legal operation names */
	for (i = 0; opcode_pairs[i * 2]; ++i) {
		/* Is this the right oprname? */
		if (streq(opcode_pairs[i * 2], str)) {
			/* Convert the second element in the pair into a Code */
			return (atoi(opcode_pairs[i * 2 + 1]));
		}
	}

	/* The code was not found, return -1 */
	return (-1);
}